

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputC3
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  reference pvVar2;
  int *ip_3;
  int *ip_2;
  int *ip_1;
  float *fp_1;
  int *ip;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0xf8);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar2[0] = '\x01';
  pvVar2[1] = '\0';
  pvVar2[2] = '\0';
  pvVar2[3] = '\0';
  pvVar2[4] = '\0';
  pvVar2[5] = '\0';
  pvVar2[6] = '\0';
  pvVar2[7] = '\0';
  pvVar2[8] = '\0';
  pvVar2[9] = '\0';
  pvVar2[10] = '\0';
  pvVar2[0xb] = '\0';
  pvVar2[0xc] = '\0';
  pvVar2[0xd] = '\0';
  pvVar2[0xe] = '\0';
  pvVar2[0xf] = '\0';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = '\0';
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = '\0';
  pvVar1[0x17] = '\0';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = '\0';
  pvVar1[0x1b] = '\0';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = '\0';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '@';
  pvVar1[0x23] = '@';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\0';
  pvVar1[0x27] = '\0';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '\0';
  pvVar1[0x2b] = '\0';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '\0';
  pvVar1[0x2f] = '\0';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = 0x80;
  pvVar1[0x33] = '@';
  pvVar1[0x34] = '\0';
  pvVar1[0x35] = '\0';
  pvVar1[0x36] = '\0';
  pvVar1[0x37] = '\0';
  pvVar1[0x38] = '\0';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = '\0';
  pvVar1[0x3b] = '\0';
  pvVar1[0x3c] = '\0';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = '\0';
  pvVar1[0x3f] = '\0';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = 0xa0;
  pvVar1[0x43] = '@';
  pvVar1[0x44] = '\0';
  pvVar1[0x45] = '\0';
  pvVar1[0x46] = '\0';
  pvVar1[0x47] = '\0';
  pvVar1[0x48] = '\0';
  pvVar1[0x49] = '\0';
  pvVar1[0x4a] = '\0';
  pvVar1[0x4b] = '\0';
  pvVar1[0x4c] = '\0';
  pvVar1[0x4d] = '\0';
  pvVar1[0x4e] = '\0';
  pvVar1[0x4f] = '\0';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = 0xc0;
  pvVar1[0x53] = '@';
  pvVar1[0x54] = '\0';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = '\0';
  pvVar1[0x57] = '\0';
  pvVar1[0x58] = '\0';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = '\0';
  pvVar1[0x5b] = '\0';
  pvVar1[0x5c] = '\0';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = '\0';
  pvVar1[0x5f] = '\0';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = 0xe0;
  pvVar1[99] = '@';
  pvVar1[100] = '\0';
  pvVar1[0x65] = '\0';
  pvVar1[0x66] = '\0';
  pvVar1[0x67] = 'A';
  pvVar1[0x68] = '\0';
  pvVar1[0x69] = '\0';
  pvVar1[0x6a] = '\0';
  pvVar1[0x6b] = '\0';
  pvVar1[0x6c] = '\0';
  pvVar1[0x6d] = '\0';
  pvVar1[0x6e] = '\0';
  pvVar1[0x6f] = '\0';
  pvVar1[0x70] = '\0';
  pvVar1[0x71] = '\0';
  pvVar1[0x72] = '\x10';
  pvVar1[0x73] = 'A';
  pvVar1[0x74] = '\0';
  pvVar1[0x75] = '\0';
  pvVar1[0x76] = ' ';
  pvVar1[0x77] = 'A';
  pvVar1[0x78] = '\0';
  pvVar1[0x79] = '\0';
  pvVar1[0x7a] = '\0';
  pvVar1[0x7b] = '\0';
  pvVar1[0x7c] = '\0';
  pvVar1[0x7d] = '\0';
  pvVar1[0x7e] = '\0';
  pvVar1[0x7f] = '\0';
  pvVar1[0x80] = '\0';
  pvVar1[0x81] = '\0';
  pvVar1[0x82] = '0';
  pvVar1[0x83] = 'A';
  pvVar1[0x84] = '\0';
  pvVar1[0x85] = '\0';
  pvVar1[0x86] = '@';
  pvVar1[0x87] = 'A';
  pvVar1[0x88] = '\0';
  pvVar1[0x89] = '\0';
  pvVar1[0x8a] = '\0';
  pvVar1[0x8b] = '\0';
  pvVar1[0x8c] = '\0';
  pvVar1[0x8d] = '\0';
  pvVar1[0x8e] = '\0';
  pvVar1[0x8f] = '\0';
  pvVar1[0x90] = '\0';
  pvVar1[0x91] = '\0';
  pvVar1[0x92] = '\0';
  pvVar1[0x93] = '\0';
  pvVar1[0x94] = '\0';
  pvVar1[0x95] = '\0';
  pvVar1[0x96] = '*';
  pvVar1[0x97] = '@';
  pvVar1[0x98] = '\0';
  pvVar1[0x99] = '\0';
  pvVar1[0x9a] = '\0';
  pvVar1[0x9b] = '\0';
  pvVar1[0x9c] = '\0';
  pvVar1[0x9d] = '\0';
  pvVar1[0x9e] = '\0';
  pvVar1[0x9f] = '\0';
  pvVar1[0xa0] = '\0';
  pvVar1[0xa1] = '\0';
  pvVar1[0xa2] = '\0';
  pvVar1[0xa3] = '\0';
  pvVar1[0xa4] = '\0';
  pvVar1[0xa5] = '\0';
  pvVar1[0xa6] = ',';
  pvVar1[0xa7] = '@';
  pvVar1[0xa8] = '\0';
  pvVar1[0xa9] = '\0';
  pvVar1[0xaa] = '\0';
  pvVar1[0xab] = '\0';
  pvVar1[0xac] = '\0';
  pvVar1[0xad] = '\0';
  pvVar1[0xae] = '\0';
  pvVar1[0xaf] = '\0';
  pvVar1[0xb0] = '\0';
  pvVar1[0xb1] = '\0';
  pvVar1[0xb2] = '\0';
  pvVar1[0xb3] = '\0';
  pvVar1[0xb4] = '\0';
  pvVar1[0xb5] = '\0';
  pvVar1[0xb6] = '.';
  pvVar1[0xb7] = '@';
  pvVar1[0xb8] = '\0';
  pvVar1[0xb9] = '\0';
  pvVar1[0xba] = '\0';
  pvVar1[0xbb] = '\0';
  pvVar1[0xbc] = '\0';
  pvVar1[0xbd] = '\0';
  pvVar1[0xbe] = '\0';
  pvVar1[0xbf] = '\0';
  pvVar2[0xc0] = '\x10';
  pvVar2[0xc1] = '\0';
  pvVar2[0xc2] = '\0';
  pvVar2[0xc3] = '\0';
  pvVar2[0xc4] = '\0';
  pvVar2[0xc5] = '\0';
  pvVar2[0xc6] = '\0';
  pvVar2[199] = '\0';
  pvVar2[200] = '\0';
  pvVar2[0xc9] = '\0';
  pvVar2[0xca] = '\0';
  pvVar2[0xcb] = '\0';
  pvVar2[0xcc] = '\0';
  pvVar2[0xcd] = '\0';
  pvVar2[0xce] = '\0';
  pvVar2[0xcf] = '\0';
  pvVar2[0xd0] = '\0';
  pvVar2[0xd1] = '\0';
  pvVar2[0xd2] = '\0';
  pvVar2[0xd3] = '\0';
  pvVar2[0xd4] = '\0';
  pvVar2[0xd5] = '\0';
  pvVar2[0xd6] = '\0';
  pvVar2[0xd7] = '\0';
  pvVar2[0xd8] = '\0';
  pvVar2[0xd9] = '\0';
  pvVar2[0xda] = '\0';
  pvVar2[0xdb] = '\0';
  pvVar2[0xdc] = '\0';
  pvVar2[0xdd] = '\0';
  pvVar2[0xde] = '\0';
  pvVar2[0xdf] = '\0';
  pvVar1[0xe0] = '\0';
  pvVar1[0xe1] = '\0';
  pvVar1[0xe2] = '\0';
  pvVar1[0xe3] = '\0';
  pvVar1[0xe4] = '\0';
  pvVar1[0xe5] = '\0';
  pvVar1[0xe6] = '1';
  pvVar1[0xe7] = '@';
  pvVar1[0xe8] = '\0';
  pvVar1[0xe9] = '\0';
  pvVar1[0xea] = '\0';
  pvVar1[0xeb] = '\0';
  pvVar1[0xec] = '\0';
  pvVar1[0xed] = '\0';
  pvVar1[0xee] = '2';
  pvVar1[0xef] = '@';
  pvVar1[0xf0] = '\0';
  pvVar1[0xf1] = '\0';
  pvVar1[0xf2] = '\0';
  pvVar1[0xf3] = '\0';
  pvVar1[0xf4] = '\0';
  pvVar1[0xf5] = '\0';
  pvVar1[0xf6] = '3';
  pvVar1[0xf7] = '@';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 1,0x80);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 1,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 1,0);
  pvVar2[0] = '\x01';
  pvVar2[1] = '\0';
  pvVar2[2] = '\0';
  pvVar2[3] = '\0';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = 0x80;
  pvVar1[0xf] = '@';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = 0xa0;
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = 0xc0;
  pvVar1[0x17] = '@';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = 0xe0;
  pvVar1[0x1b] = '@';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = 'A';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\x10';
  pvVar1[0x23] = 'A';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = ' ';
  pvVar1[0x27] = 'A';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '0';
  pvVar1[0x2b] = 'A';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '@';
  pvVar1[0x2f] = 'A';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = '\0';
  pvVar1[0x33] = '\0';
  pvVar1[0x34] = '\0';
  pvVar1[0x35] = '\0';
  pvVar1[0x36] = '*';
  pvVar1[0x37] = '@';
  pvVar1[0x38] = '\0';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = '\0';
  pvVar1[0x3b] = '\0';
  pvVar1[0x3c] = '\0';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = ',';
  pvVar1[0x3f] = '@';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = '\0';
  pvVar1[0x43] = '\0';
  pvVar1[0x44] = '\0';
  pvVar1[0x45] = '\0';
  pvVar1[0x46] = '.';
  pvVar1[0x47] = '@';
  pvVar2[0x48] = '\x10';
  pvVar2[0x49] = '\0';
  pvVar2[0x4a] = '\0';
  pvVar2[0x4b] = '\0';
  pvVar2[0x4c] = '\0';
  pvVar2[0x4d] = '\0';
  pvVar2[0x4e] = '\0';
  pvVar2[0x4f] = '\0';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = '\0';
  pvVar1[0x53] = '\0';
  pvVar1[0x54] = '\0';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = '\0';
  pvVar1[0x57] = '\0';
  pvVar1[0x58] = '\0';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = '\0';
  pvVar1[0x5b] = '\0';
  pvVar1[0x5c] = '\0';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = '\0';
  pvVar1[0x5f] = '\0';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = '\0';
  pvVar1[99] = '\0';
  pvVar1[100] = '\0';
  pvVar1[0x65] = '\0';
  pvVar1[0x66] = '1';
  pvVar1[0x67] = '@';
  pvVar1[0x68] = '\0';
  pvVar1[0x69] = '\0';
  pvVar1[0x6a] = '\0';
  pvVar1[0x6b] = '\0';
  pvVar1[0x6c] = '\0';
  pvVar1[0x6d] = '\0';
  pvVar1[0x6e] = '2';
  pvVar1[0x6f] = '@';
  pvVar1[0x70] = '\0';
  pvVar1[0x71] = '\0';
  pvVar1[0x72] = '\0';
  pvVar1[0x73] = '\0';
  pvVar1[0x74] = '\0';
  pvVar1[0x75] = '\0';
  pvVar1[0x76] = '3';
  pvVar1[0x77] = '@';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 2,0x14);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 2,0);
  pvVar1[0] = '\x01';
  pvVar1[1] = '\0';
  pvVar1[2] = '\0';
  pvVar1[3] = '\0';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar1[0x10] = '\x02';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = '\0';
  pvVar1[0x13] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 3,8);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 3,0);
  pvVar1[0] = '\x01';
  pvVar1[1] = '\0';
  pvVar1[2] = '\0';
  pvVar1[3] = '\0';
  pvVar1[4] = '\x02';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  return 
  "\nlayout(std140, binding = 0) buffer Input0 {\n  int data0;\n  float data1[5];\n  mat3x2 data2;\n  double data3;\n  double data4[2];\n  int data5;\n  dvec3 data6;\n} g_input0;\nlayout(std430, binding = 1) buffer Input1 {\n  int data0;\n  float data1[5];\n  mat3x2 data2;\n  double data3;\n  double data4[2];\n  int data5;\n  dvec3 data6;\n} g_input1;\nstruct Struct0 {\n  int data0;\n};\nlayout(std140, binding = 2) buffer Input2 {\n  int data0;\n  Struct0 data1;\n} g_input2;\nlayout(std430, binding = 3) buffer Input3 {\n  int data0;\n  Struct0 data1;\n} g_input3;\nlayout(std140, binding = 4) buffer Output0 {\n  int data0;\n  float data1[5];\n  mat3x2 data2;\n  double data3;\n  double data4[2];\n  int data5;\n  dvec3 data6;\n} g_output0;\nlayout(std430, binding = 5) buffer Output1 {\n  int data0;\n  float data1[5];\n  mat3x2 data2;\n  double data3;\n  double data4[2];\n  int data5;\n  dvec3 data6;\n} g_output1;\nlayout(std140, binding = 6) buffer Output2 {\n  int data0;\n  Struct0 data1;\n} g_output2;\nlayout(std430, binding = 7) buffer Output3 {\n  int data0;\n  Struct0 data1;\n} g_output3;\nvoid main() {\n  g_output0.data0 = g_input0.data0;\n  for (int i = 0; i < g_input0.data1.length(); ++i) g_output0.data1[i] = g_input0.data1[i];\n  g_output0.data2 = g_input0.data2;\n  g_output0.data3 = g_input0.data3;\n  for (int i = 0; i < g_input0.data4.length(); ++i) g_output0.data4[i] = g_input0.data4[i];\n  g_output0.data5 = g_input0.data5;\n  g_output0.data6 = g_input0.data6;\n  g_output1.data0 = g_input1.data0;\n  for (int i = 0; i < g_input1.data1.length(); ++i) g_output1.data1[i] = g_input1.data1[i];\n  g_output1.data2 = g_input1.data2;\n  g_output1.data3 = g_input1.data3;\n  for (int i = 0; i < g_input1.data4.length(); ++i) g_output1.data4[i] = g_input1.data4[i];\n  g_output1.data5 = g_input1.data5;\n  g_output1.data6 = g_input1.data6;\n  g_output2.data0 = g_input2.data0;\n  g_output2.data1 = g_input2.data1;\n  g_output3.data0 = g_input3.data0;\n  g_output3.data1 = g_input3.data1;\n}"
  ;
}

Assistant:

const char* GetInputC3(std::vector<GLubyte> in_data[4])
{
	/* input 0, std140 */
	{
		in_data[0].resize(62 * 4);
		float* fp							= reinterpret_cast<float*>(&in_data[0][0]);
		int*   ip							= reinterpret_cast<int*>(&in_data[0][0]);
		ip[0]								= 1;
		ip[1]								= 0;
		ip[2]								= 0;
		ip[3]								= 0;
		fp[4]								= 2.0f;
		fp[5]								= 0.0f;
		fp[6]								= 0.0f;
		fp[7]								= 0.0f;
		fp[8]								= 3.0f;
		fp[9]								= 0.0f;
		fp[10]								= 0.0f;
		fp[11]								= 0.0f;
		fp[12]								= 4.0f;
		fp[13]								= 0.0f;
		fp[14]								= 0.0f;
		fp[15]								= 0.0f;
		fp[16]								= 5.0f;
		fp[17]								= 0.0f;
		fp[18]								= 0.0f;
		fp[19]								= 0.0f;
		fp[20]								= 6.0f;
		fp[21]								= 0.0f;
		fp[22]								= 0.0f;
		fp[23]								= 0.0f;
		fp[24]								= 7.0f;
		fp[25]								= 8.0f;
		fp[26]								= 0.0f;
		fp[27]								= 0.0f;
		fp[28]								= 9.0f;
		fp[29]								= 10.0f;
		fp[30]								= 0.0f;
		fp[31]								= 0.0f;
		fp[32]								= 11.0f;
		fp[33]								= 12.0f;
		fp[34]								= 0.0f;
		fp[35]								= 0.0f;
		*reinterpret_cast<double*>(fp + 36) = 13.0;
		*reinterpret_cast<double*>(fp + 38) = 0.0;
		*reinterpret_cast<double*>(fp + 40) = 14.0;
		*reinterpret_cast<double*>(fp + 42) = 0.0;
		*reinterpret_cast<double*>(fp + 44) = 15.0;
		*reinterpret_cast<double*>(fp + 46) = 0.0;
		ip[48]								= 16;
		ip[49]								= 0;
		ip[50]								= 0;
		ip[51]								= 0;
		ip[52]								= 0;
		ip[53]								= 0;
		ip[54]								= 0;
		ip[55]								= 0;
		*reinterpret_cast<double*>(fp + 56) = 17.0;
		*reinterpret_cast<double*>(fp + 58) = 18.0;
		*reinterpret_cast<double*>(fp + 60) = 19.0;
	}
	/* input 1, std430 */
	{
		in_data[1].resize(32 * 4);
		float* fp							= reinterpret_cast<float*>(&in_data[1][0]);
		int*   ip							= reinterpret_cast<int*>(&in_data[1][0]);
		ip[0]								= 1;
		fp[1]								= 2.0f;
		fp[2]								= 3.0f;
		fp[3]								= 4.0f;
		fp[4]								= 5.0f;
		fp[5]								= 6.0f;
		fp[6]								= 7.0f;
		fp[7]								= 8.0f;
		fp[8]								= 9.0f;
		fp[9]								= 10.0f;
		fp[10]								= 11.0f;
		fp[11]								= 12.0f;
		*reinterpret_cast<double*>(fp + 12) = 13.0;
		*reinterpret_cast<double*>(fp + 14) = 14.0;
		*reinterpret_cast<double*>(fp + 16) = 15.0;
		ip[18]								= 16;
		ip[19]								= 0;
		*reinterpret_cast<double*>(fp + 20) = 0.0;
		*reinterpret_cast<double*>(fp + 22) = 0.0;
		*reinterpret_cast<double*>(fp + 24) = 17.0;
		*reinterpret_cast<double*>(fp + 26) = 18.0;
		*reinterpret_cast<double*>(fp + 28) = 19.0;
	}
	/* input 2, std140 */
	{
		in_data[2].resize(5 * 4);
		int* ip = reinterpret_cast<int*>(&in_data[2][0]);
		ip[0]   = 1;
		ip[1]   = 0;
		ip[2]   = 0;
		ip[3]   = 0;
		ip[4]   = 2;
	}
	/* input 3, std430 */
	{
		in_data[3].resize(2 * 4);
		int* ip = reinterpret_cast<int*>(&in_data[3][0]);
		ip[0]   = 1;
		ip[1]   = 2;
	}
	return NL "layout(std140, binding = 0) buffer Input0 {" NL "  int data0;" NL "  float data1[5];" NL
			  "  mat3x2 data2;" NL "  double data3;" NL "  double data4[2];" NL "  int data5;" NL "  dvec3 data6;" NL
			  "} g_input0;" NL "layout(std430, binding = 1) buffer Input1 {" NL "  int data0;" NL "  float data1[5];" NL
			  "  mat3x2 data2;" NL "  double data3;" NL "  double data4[2];" NL "  int data5;" NL "  dvec3 data6;" NL
			  "} g_input1;" NL "struct Struct0 {" NL "  int data0;" NL "};" NL
			  "layout(std140, binding = 2) buffer Input2 {" NL "  int data0;" NL "  Struct0 data1;" NL "} g_input2;" NL
			  "layout(std430, binding = 3) buffer Input3 {" NL "  int data0;" NL "  Struct0 data1;" NL "} g_input3;"

		NL "layout(std140, binding = 4) buffer Output0 {" NL "  int data0;" NL "  float data1[5];" NL
			  "  mat3x2 data2;" NL "  double data3;" NL "  double data4[2];" NL "  int data5;" NL "  dvec3 data6;" NL
			  "} g_output0;" NL "layout(std430, binding = 5) buffer Output1 {" NL "  int data0;" NL
			  "  float data1[5];" NL "  mat3x2 data2;" NL "  double data3;" NL "  double data4[2];" NL "  int data5;" NL
			  "  dvec3 data6;" NL "} g_output1;" NL "layout(std140, binding = 6) buffer Output2 {" NL "  int data0;" NL
			  "  Struct0 data1;" NL "} g_output2;" NL "layout(std430, binding = 7) buffer Output3 {" NL
			  "  int data0;" NL "  Struct0 data1;" NL "} g_output3;" NL "void main() {" NL
			  "  g_output0.data0 = g_input0.data0;" NL
			  "  for (int i = 0; i < g_input0.data1.length(); ++i) g_output0.data1[i] = g_input0.data1[i];" NL
			  "  g_output0.data2 = g_input0.data2;" NL "  g_output0.data3 = g_input0.data3;" NL
			  "  for (int i = 0; i < g_input0.data4.length(); ++i) g_output0.data4[i] = g_input0.data4[i];" NL
			  "  g_output0.data5 = g_input0.data5;" NL "  g_output0.data6 = g_input0.data6;"

		NL "  g_output1.data0 = g_input1.data0;" NL
			  "  for (int i = 0; i < g_input1.data1.length(); ++i) g_output1.data1[i] = g_input1.data1[i];" NL
			  "  g_output1.data2 = g_input1.data2;" NL "  g_output1.data3 = g_input1.data3;" NL
			  "  for (int i = 0; i < g_input1.data4.length(); ++i) g_output1.data4[i] = g_input1.data4[i];" NL
			  "  g_output1.data5 = g_input1.data5;" NL "  g_output1.data6 = g_input1.data6;"

		NL "  g_output2.data0 = g_input2.data0;" NL "  g_output2.data1 = g_input2.data1;"

		NL "  g_output3.data0 = g_input3.data0;" NL "  g_output3.data1 = g_input3.data1;" NL "}";
}